

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_plot.cc
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double __x;
  
  iVar2 = 200;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    dVar4 = random_double();
    dVar5 = random_double();
    dVar6 = cos(dVar4 * 6.283185307179586);
    __x = (1.0 - dVar5) * dVar5;
    dVar7 = SQRT(__x);
    dVar8 = dVar7;
    if (__x < 0.0) {
      dVar8 = sqrt(__x);
    }
    dVar4 = sin(dVar4 * 6.283185307179586);
    if (__x < 0.0) {
      dVar7 = sqrt(__x);
    }
    poVar1 = std::ostream::_M_insert<double>((dVar6 + dVar6) * dVar8);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>((dVar4 + dVar4) * dVar7);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>(1.0 - (dVar5 + dVar5));
    std::operator<<(poVar1,'\n');
  }
  return 0;
}

Assistant:

int main() {
    for (int i = 0; i < 200; i++) {
        auto r1 = random_double();
        auto r2 = random_double();
        auto x = std::cos(2*pi*r1) * 2 * std::sqrt(r2*(1-r2));
        auto y = std::sin(2*pi*r1) * 2 * std::sqrt(r2*(1-r2));
        auto z = 1 - 2*r2;
        std::cout << x << " " << y << " " << z << '\n';
    }
}